

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void __thiscall utf8_ptr::dec(utf8_ptr *this,size_t *rem)

{
  char *pcVar1;
  long *in_RSI;
  long *in_RDI;
  char *p;
  
  pcVar1 = s_dec((char *)0x37f900);
  *in_RSI = (*in_RDI - (long)pcVar1) + *in_RSI;
  *in_RDI = (long)pcVar1;
  return;
}

Assistant:

void dec(size_t *rem)
    {
        /* calculate the decrement amount */
        char *p = s_dec(p_);

        /* decrement the length counter by the change */
        *rem += (p_ - p);
        
        /* save the new pointer value */
        p_ = p;
    }